

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.c
# Opt level: O0

void do_incbin(int *ip)

{
  int iVar1;
  char *__s;
  char *pcVar2;
  FILE *__stream;
  long lVar3;
  char local_a8 [4];
  int size;
  char fname [128];
  char *p;
  FILE *fp;
  int *ip_local;
  
  iVar1 = getstring(ip,local_a8,0x7f);
  if (iVar1 == 0) {
    return;
  }
  __s = strrchr(local_a8,0x2e);
  if ((__s != (char *)0x0) && (pcVar2 = strchr(__s,0x2f), pcVar2 == (char *)0x0)) {
    iVar1 = strcasecmp(__s,".mx");
    if (iVar1 == 0) {
      do_mx(local_a8);
      return;
    }
    iVar1 = strcasecmp(__s,".fmp");
    if ((iVar1 == 0) && (iVar1 = pce_load_map(local_a8,0), iVar1 != 0)) {
      return;
    }
  }
  labldef(loccnt,1);
  if (pass == 1) {
    loadlc(loccnt,0);
  }
  __stream = (FILE *)open_file(local_a8,"rb");
  if (__stream == (FILE *)0x0) {
    fatal_error("Can not open file!");
  }
  else {
    fseek(__stream,0,2);
    lVar3 = ftell(__stream);
    iVar1 = (int)lVar3;
    fseek(__stream,0,0);
    if (rom_limit < bank * 0x2000 + loccnt + iVar1) {
      fclose(__stream);
      error("ROM overflow!");
    }
    else {
      if (pass == 1) {
        fread(rom[bank] + loccnt,1,(long)iVar1,__stream);
        memset(map[bank] + loccnt,section + page * 0x20 & 0xff,(long)iVar1);
        println();
      }
      fclose(__stream);
      bank = (loccnt + iVar1 >> 0xd) + bank;
      loccnt = loccnt + iVar1 & 0x1fff;
      if ((max_bank < bank) && (max_bank = bank, loccnt == 0)) {
        max_bank = bank + -1;
      }
      if (lablptr == (t_symbol *)0x0) {
        if ((lastlabl != (t_symbol *)0x0) && (lastlabl->data_type == 7)) {
          lastlabl->data_size = iVar1 + lastlabl->data_size;
        }
      }
      else {
        lablptr->data_type = 7;
        lablptr->data_size = iVar1;
      }
    }
  }
  return;
}

Assistant:

void
do_incbin(int *ip)
{
	FILE *fp;
	char *p;
	char fname[128];
	int  size;

	/* get file name */
	if (!getstring(ip, fname, 127))
		return;

	/* get file extension */
	if ((p = strrchr(fname, '.')) != NULL) {
		if (!strchr(p, PATH_SEPARATOR)) {
			/* check if it's a mx file */
			if (!strcasecmp(p, ".mx")) {
				do_mx(fname);
				return;
			}
			/* check if it's a map file */
			if (!strcasecmp(p, ".fmp")) {
				if (pce_load_map(fname, 0))
					return;
			}
		}
	}

	/* define label */
	labldef(loccnt, 1);

	/* output */
	if (pass == LAST_PASS)
		loadlc(loccnt, 0);

	/* open file */
	if ((fp = open_file(fname, "rb")) == NULL) {
		fatal_error("Can not open file!");
		return;
	}

	/* get file size */
	fseek(fp, 0, SEEK_END);
	size = ftell(fp);
	fseek(fp, 0, SEEK_SET);

	/* check if it will fit in the rom */
	if (((bank << 13) + loccnt + size) > rom_limit) {
		fclose(fp);
		error("ROM overflow!");
		return;
	}

	/* load data on last pass */
	if (pass == LAST_PASS) {
		fread(&rom[bank][loccnt], 1, size, fp);
		memset(&map[bank][loccnt], section + (page << 5), size);

		/* output line */
		println();
	}

	/* close file */
	fclose(fp);

	/* update bank and location counters */
	bank  += (loccnt + size) >> 13;
	loccnt = (loccnt + size) & 0x1FFF;
	if (bank > max_bank) {
		if (loccnt)
			max_bank = bank;
		else
			max_bank = bank - 1;
	}

	/* size */
	if (lablptr) {
		lablptr->data_type = P_INCBIN;
		lablptr->data_size = size;
	}
	else {
		if (lastlabl) {
			if (lastlabl->data_type == P_INCBIN)
				lastlabl->data_size += size;
		}
	}
}